

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

CURLcode Curl_resolver_is_resolved(Curl_easy *data,Curl_dns_entry **entry)

{
  Curl_async *async;
  int iVar1;
  thread_data *ptVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  CURLcode CVar6;
  uint uVar7;
  timediff_t tVar8;
  long lVar9;
  curltime cVar10;
  curltime newer;
  curltime older;
  
  ptVar2 = (data->state).async.tdata;
  *entry = (Curl_dns_entry *)0x0;
  if (ptVar2 == (thread_data *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock((pthread_mutex_t *)(ptVar2->tsd).mtx);
  iVar1 = (ptVar2->tsd).done;
  pthread_mutex_unlock((pthread_mutex_t *)(ptVar2->tsd).mtx);
  if (iVar1 != 0) {
    async = &(data->state).async;
    getaddrinfo_complete(data);
    if ((data->state).async.dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(async);
      *entry = (data->state).async.dns;
      return CURLE_OK;
    }
    CVar6 = Curl_resolver_error(data);
    destroy_async_data(async);
    return CVar6;
  }
  cVar10 = Curl_now();
  uVar3 = (data->progress).t_startsingle.tv_sec;
  uVar4 = (data->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar10._0_12_,0);
  newer.tv_usec = SUB124(cVar10._0_12_,8);
  older._12_4_ = 0;
  tVar8 = Curl_timediff(newer,older);
  lVar9 = 0;
  if (0 < tVar8) {
    lVar9 = tVar8;
  }
  if (ptVar2->poll_interval == 0) {
    uVar7 = 1;
  }
  else {
    uVar5 = ptVar2->poll_interval << (ptVar2->interval_end <= lVar9);
    uVar7 = uVar5;
    if (0xf9 < uVar5) {
      uVar7 = 0xfa;
    }
    if (lVar9 < ptVar2->interval_end && uVar5 < 0xfb) goto LAB_001119f1;
  }
  ptVar2->poll_interval = uVar7;
LAB_001119f1:
  ptVar2->interval_end = lVar9 + (ulong)uVar7;
  Curl_expire(data,(ulong)uVar7,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct Curl_easy *data,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data *td = data->state.async.tdata;
  int done = 0;

  DEBUGASSERT(entry);
  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(data);

    if(!data->state.async.dns) {
      CURLcode result = Curl_resolver_error(data);
      destroy_async_data(&data->state.async);
      return result;
    }
    destroy_async_data(&data->state.async);
    *entry = data->state.async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    /* should be fine even if this converts to 32-bit */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}